

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_digit.c
# Opt level: O2

void convert_numerative_pron(char **list,NJDNode *node1,NJDNode *node2)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  char **ppcVar5;
  long lVar6;
  char buff [1024];
  char acStack_428 [1024];
  
  pcVar3 = NJDNode_get_string(node1);
  if ((*pcVar3 != '*') || (pcVar3[1] != '\0')) {
    for (uVar4 = 0; list[uVar4] != (char *)0x0; uVar4 = uVar4 + 2) {
      iVar1 = strcmp(list[uVar4],pcVar3);
      if (iVar1 == 0) {
        iVar1 = atoi(*(char **)((long)list + ((uVar4 & 0xffffffff) << 3 | 8)));
        if (iVar1 == 1) {
          lVar6 = 0;
          ppcVar5 = njd_set_digit_rule_voiced_sound_symbol_list;
          while( true ) {
            if (lVar6 == 0x140) {
              return;
            }
            pcVar3 = NJDNode_get_pron(node2);
            uVar2 = strtopcmp(pcVar3,*(char **)((long)njd_set_digit_rule_voiced_sound_symbol_list +
                                               lVar6));
            if (-1 < (int)uVar2) break;
            lVar6 = lVar6 + 0x10;
          }
        }
        else {
          if (iVar1 != 2) {
            return;
          }
          lVar6 = 0;
          ppcVar5 = njd_set_digit_rule_semivoiced_sound_symbol_list;
          while( true ) {
            if (lVar6 == 0x50) {
              return;
            }
            pcVar3 = NJDNode_get_pron(node2);
            uVar2 = strtopcmp(pcVar3,*(char **)((long)
                                                njd_set_digit_rule_semivoiced_sound_symbol_list +
                                               lVar6));
            if (-1 < (int)uVar2) break;
            lVar6 = lVar6 + 0x10;
          }
        }
        strcpy(acStack_428,*(char **)((long)ppcVar5 + lVar6 + 8));
        strcat(acStack_428,pcVar3 + uVar2);
        NJDNode_set_pron(node2,acStack_428);
        return;
      }
    }
  }
  return;
}

Assistant:

static void convert_numerative_pron(const char *list[], NJDNode * node1, NJDNode * node2)
{
   int i, j;
   int type = 0;
   const char *str = NJDNode_get_string(node1);
   char buff[MAXBUFLEN];

   if (strcmp(str, "*") == 0)
      return;
   for (i = 0; list[i] != NULL; i += 2) {
      if (strcmp(list[i], str) == 0) {
         type = atoi(list[i + 1]);
         break;
      }
   }
   if (type == 1) {
      for (i = 0; njd_set_digit_rule_voiced_sound_symbol_list[i] != NULL; i += 2) {
         str = NJDNode_get_pron(node2);
         j = strtopcmp(str, njd_set_digit_rule_voiced_sound_symbol_list[i]);
         if (j >= 0) {
            strcpy(buff, njd_set_digit_rule_voiced_sound_symbol_list[i + 1]);
            strcat(buff, &str[j]);
            NJDNode_set_pron(node2, buff);
            break;
         }
      }
   } else if (type == 2) {
      for (i = 0; njd_set_digit_rule_semivoiced_sound_symbol_list[i] != NULL; i += 2) {
         str = NJDNode_get_pron(node2);
         j = strtopcmp(str, njd_set_digit_rule_semivoiced_sound_symbol_list[i]);
         if (j >= 0) {
            strcpy(buff, njd_set_digit_rule_semivoiced_sound_symbol_list[i + 1]);
            strcat(buff, &str[j]);
            NJDNode_set_pron(node2, buff);
            break;
         }
      }
   }
}